

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myexpand.c
# Opt level: O2

void read_file(FILE *file,int tabstop)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  while( true ) {
    while( true ) {
      iVar1 = fgetc((FILE *)file);
      iVar1 = iVar1 << 0x18;
      if (iVar1 != 0x9000000) break;
      iVar3 = (iVar2 / tabstop + 1) * tabstop;
      for (iVar1 = iVar2; iVar1 < iVar3; iVar1 = iVar1 + 1) {
        fputc(0x20,_stdout);
      }
      if (iVar2 <= iVar3) {
        iVar2 = iVar3;
      }
    }
    if (iVar1 == -0x1000000) break;
    iVar2 = iVar2 + 1;
    fputc(iVar1 >> 0x18,_stdout);
    if (iVar1 == 0xa000000) {
      iVar2 = 0;
    }
  }
  iVar2 = feof((FILE *)file);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s ERROR:\t",name);
    fwrite("couldn\'t read file to end",0x19,1,_stderr);
    fputc(10,_stderr);
    exit(1);
  }
  return;
}

Assistant:

static void read_file(FILE *file, int tabstop)
{
	char readChar;
	int writePos = 0;
	while ((readChar = fgetc(file)) != EOF)
	{
		if (readChar == '\t')
		{
			int p = tabstop * ((writePos / tabstop) + 1);
			for (; writePos < p; writePos++)
			{
				fprintf(stdout, "%c", ' ');
			}
			continue;
		}

		writePos++;
		fprintf(stdout, "%c", readChar);
		if (readChar == '\n')
		{
			writePos = 0;
		}
	}
	if (!feof(file))
	{
		ERROR_EXIT("couldn't read file to end");
	}
}